

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayer.cpp
# Opt level: O2

bool __thiscall tfs::DnnLayer::forward(DnnLayer *this)

{
  int iVar1;
  
  do {
    iVar1 = (*this->_vptr_DnnLayer[5])(this);
    if (SUB41(iVar1,0) == false) {
      return false;
    }
    this = this->m_next_layer;
  } while (this != (DnnLayer *)0x0);
  return SUB41(iVar1,0);
}

Assistant:

bool
    DnnLayer::forward( void ) {
        // -----------------------------------------------------------------------------------
        // Forward propagate while training
        // -----------------------------------------------------------------------------------
        if( !runForward()) {
            return false;
        }
        if( m_next_layer != 0 ) {
            return m_next_layer->forward();
        }
        return true;
    }